

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O0

int __thiscall Merlin::init(Merlin *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined8 uVar4;
  ulong uVar5;
  Merlin *pMVar6;
  double dVar7;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  double local_20;
  double timestamp;
  Merlin *this_local;
  
  timestamp = (double)this;
  local_20 = merlin::timeSystem();
  if ((this->m_useFiles & 1U) == 0) {
    std::__cxx11::string::string(local_40,(string *)&this->m_modelString);
    bVar1 = read_model(this,(string *)local_40);
    uVar4 = std::__cxx11::string::~string(local_40);
    pMVar6 = (Merlin *)CONCAT71((int7)((ulong)uVar4 >> 8),bVar1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = 0;
      goto LAB_0022678a;
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::string(local_70,(string *)&this->m_evidenceString);
      bVar1 = read_evidence(this,(string *)local_70);
      uVar4 = std::__cxx11::string::~string(local_70);
      pMVar6 = (Merlin *)CONCAT71((int7)((ulong)uVar4 >> 8),bVar1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_0022678a;
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::string(local_90,(string *)&this->m_virtualEvidenceString);
      bVar1 = read_virtual_evidence(this,(string *)local_90);
      uVar4 = std::__cxx11::string::~string(local_90);
      pMVar6 = (Merlin *)CONCAT71((int7)((ulong)uVar4 >> 8),bVar1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_0022678a;
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::string(local_b0,(string *)&this->m_queryString);
      bVar1 = read_query(this,(string *)local_b0);
      uVar4 = std::__cxx11::string::~string(local_b0);
      pMVar6 = (Merlin *)CONCAT71((int7)((ulong)uVar4 >> 8),bVar1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_0022678a;
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::string(local_d0,(string *)&this->m_datasetString);
      bVar1 = read_dataset(this,(string *)local_d0);
      uVar4 = std::__cxx11::string::~string(local_d0);
      pMVar6 = (Merlin *)CONCAT71((int7)((ulong)uVar4 >> 8),bVar1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_0022678a;
      }
    }
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = read_model(this,pcVar3);
    if (!bVar1) {
      this_local._7_1_ = 0;
      pMVar6 = (Merlin *)CONCAT71(extraout_var,bVar1);
      goto LAB_0022678a;
    }
    bVar2 = std::__cxx11::string::empty();
    if ((bVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = read_evidence(this,pcVar3);
      if (!bVar1) {
        this_local._7_1_ = 0;
        pMVar6 = (Merlin *)CONCAT71(extraout_var_00,bVar1);
        goto LAB_0022678a;
      }
    }
    bVar2 = std::__cxx11::string::empty();
    if ((bVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = read_virtual_evidence(this,pcVar3);
      if (!bVar1) {
        this_local._7_1_ = 0;
        pMVar6 = (Merlin *)CONCAT71(extraout_var_01,bVar1);
        goto LAB_0022678a;
      }
    }
    bVar2 = std::__cxx11::string::empty();
    if ((bVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = read_query(this,pcVar3);
      if (!bVar1) {
        this_local._7_1_ = 0;
        pMVar6 = (Merlin *)CONCAT71(extraout_var_02,bVar1);
        goto LAB_0022678a;
      }
    }
    bVar2 = std::__cxx11::string::empty();
    if ((bVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = read_dataset(this,pcVar3);
      if (!bVar1) {
        this_local._7_1_ = 0;
        pMVar6 = (Merlin *)CONCAT71(extraout_var_03,bVar1);
        goto LAB_0022678a;
      }
    }
  }
  dVar7 = merlin::timeSystem();
  this->m_ioTime = dVar7 - local_20;
  this_local._7_1_ = 1;
  pMVar6 = this;
LAB_0022678a:
  return (int)CONCAT71((int7)((ulong)pMVar6 >> 8),this_local._7_1_);
}

Assistant:

bool Merlin::init() {

	double timestamp = merlin::timeSystem();
	if (m_useFiles) { // input files
		if (!read_model(m_modelFile.c_str())) {
			return false;
		}
		if (m_evidenceFile.empty() == false) {
			if (!read_evidence(m_evidenceFile.c_str())) {
				return false;
			}
		}
		if (m_virtualEvidenceFile.empty() == false) {
			if (!read_virtual_evidence(m_virtualEvidenceFile.c_str())) {
				return false;
			}
		}
		if (m_queryFile.empty() == false) {
			if (!read_query(m_queryFile.c_str())) {
				return false;
			}
		}
		if (m_datasetFile.empty() == false) {
			if (!read_dataset(m_datasetFile.c_str())) {
				return false;
			}
		}
	} else { // input strings
		if (!read_model(m_modelString)) {
			return false;
		}
		if (m_evidenceString.empty()) {
			if (!read_evidence(m_evidenceString)) {
				return false;
			}
		}
		if (m_virtualEvidenceString.empty()) {
			if (!read_virtual_evidence(m_virtualEvidenceString)) {
				return false;
			}
		}
		if (!m_queryString.empty()) {
			if (!read_query(m_queryString)) {
				return false;
			}
		}
		if (!m_datasetString.empty()) {
			if (!read_dataset(m_datasetString)) {
				return false;
			}
		}
	}

	m_ioTime = (merlin::timeSystem() - timestamp);
	return true;
}